

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

bool __thiscall Minisat::Solver::isSimplifyDuplicate(Solver *this,CRef cr)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_long *puVar5;
  unsigned_long uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  char cVar14;
  
  uVar2 = (this->simplifyBuffer).ring.sz;
  uVar7 = 0;
  if ((ulong)uVar2 != 0) {
    puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    puVar1 = (ulong *)(puVar4 + cr);
    if (0 < (int)uVar2) {
      uVar7 = 0;
      do {
        uVar3 = (this->simplifyBuffer).ring.data[uVar7];
        if ((uVar3 != cr && uVar3 != 0xffffffff) &&
           ((*(ulong *)(puVar4 + uVar3) ^ *puVar1) < 0x400000000)) goto LAB_00113367;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
      uVar7 = (ulong)uVar2;
    }
LAB_00113367:
    if ((uint)uVar7 != uVar2) {
      this->counter = this->counter + 1;
      if (*puVar1 < 0x400000000) {
        uVar11 = *puVar1 >> 0x22;
      }
      else {
        puVar5 = (this->seen2).data;
        uVar9 = 0;
        do {
          puVar5[*(int *)((long)puVar1 + uVar9 * 4 + 8)] = this->counter;
          uVar9 = uVar9 + 1;
          uVar11 = *puVar1 >> 0x22;
        } while (uVar9 < uVar11);
      }
      if ((int)(uint)uVar7 < (int)uVar2) {
        uVar7 = uVar7 & 0xffffffff;
        do {
          uVar3 = (this->simplifyBuffer).ring.data[uVar7];
          cVar14 = '\n';
          if (uVar3 != cr && uVar3 != 0xffffffff) {
            uVar9 = *(ulong *)(puVar4 + uVar3);
            uVar8 = (uint)(uVar9 >> 0x22);
            if ((uint)uVar11 == uVar8) {
              uVar10 = 0;
              if (0x3ffffffff < uVar9) {
                uVar10 = 0;
                uVar12 = 1;
                do {
                  uVar6 = (this->seen2).data[(int)puVar4[(ulong)uVar3 + uVar12 + 1]];
                  uVar10 = (uVar6 == this->counter) + uVar10;
                  if (uVar6 != this->counter) break;
                  bVar13 = uVar12 < uVar9 >> 0x22;
                  uVar12 = uVar12 + 1;
                } while (bVar13);
              }
              cVar14 = uVar10 == uVar8;
            }
          }
          if ((cVar14 != '\n') && (cVar14 != '\0')) {
            uVar7 = 1;
            goto LAB_0011345f;
          }
          uVar7 = uVar7 + 1;
        } while ((int)uVar7 < (int)uVar2);
      }
    }
    uVar7 = 0;
  }
LAB_0011345f:
  return SUB81(uVar7,0);
}

Assistant:

int size(void) const { return sz; }